

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

int __thiscall
Js::ByteCodeWriter::AuxNoReg(ByteCodeWriter *this,OpCode op,void *buffer,int byteCount,int C1)

{
  uint local_34;
  int32 local_30;
  OpLayoutAuxNoReg data;
  int currentOffset;
  int C1_local;
  int byteCount_local;
  void *buffer_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.C1 = C1;
  CheckOpen(this);
  local_34 = InsertAuxiliaryData(this,buffer,byteCount);
  local_30 = data.C1;
  data.Offset = local_34;
  Data::Encode(&this->m_byteCodeData,op,&local_34,8,this);
  return data.Offset;
}

Assistant:

int ByteCodeWriter::AuxNoReg(OpCode op, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();

        //
        // Write the buffer's contents
        //

        int currentOffset = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxNoReg data;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }